

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  Tokenizer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  string field_name;
  string local_80;
  string local_60;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"[","");
  bVar3 = TryConsume(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (bVar3) {
    bVar3 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar3) {
      return false;
    }
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"]","");
    bVar3 = ConsumeBeforeWhitespace(this,&local_80);
  }
  else {
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = ConsumeIdentifierBeforeWhitespace(this,&local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (bVar3 == false) {
    return false;
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Unknown/Reserved","");
  this_00 = &this->tokenizer_;
  if ((this->tokenizer_).current_.type == TYPE_WHITESPACE) {
    io::Tokenizer::Next(this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,":","");
  bVar3 = TryConsumeBeforeWhitespace(this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (bVar3) {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Unknown/Reserved","");
    if ((this_00->current_).type == TYPE_WHITESPACE) {
      io::Tokenizer::Next(this_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"{","");
    sVar2 = (this->tokenizer_).current_.text._M_string_length;
    if (sVar2 == local_80._M_string_length) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_80._M_dataplus._M_p,
                     sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
LAB_003bfbac:
      bVar5 = false;
    }
    else {
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"<","");
      sVar2 = (this->tokenizer_).current_.text._M_string_length;
      bVar5 = true;
      if (sVar2 == local_38) {
        if (sVar2 == 0) goto LAB_003bfbac;
        iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_40,sVar2);
        bVar5 = iVar4 != 0;
      }
    }
    if ((!bVar3) && (local_40 != local_30)) {
      operator_delete(local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (bVar5) {
      bVar3 = SkipFieldValue(this);
      goto LAB_003bfc34;
    }
  }
  bVar3 = SkipFieldMessage(this);
LAB_003bfc34:
  if (bVar3 == false) {
    return false;
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,";","");
  bVar3 = TryConsume(this,&local_80);
  if (!bVar3) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,",","");
    TryConsume(this,&local_60);
    if ((!bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2)) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(ConsumeBeforeWhitespace("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
    }
    TryConsumeWhitespace("Unknown/Reserved", "n/a");

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsumeBeforeWhitespace(":")) {
      TryConsumeWhitespace("Unknown/Reserved", "n/a");
      if (!LookingAt("{") && !LookingAt("<")) {
        DO(SkipFieldValue());
      } else {
        DO(SkipFieldMessage());
      }
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }